

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_reader.c
# Opt level: O3

int dlep_reader_mac_tlv(oonf_layer2_neigh_key *key,dlep_session *session,dlep_parser_value *value)

{
  int iVar1;
  
  if (value == (dlep_parser_value *)0x0) {
    value = dlep_session_get_tlv_value(session,7);
    if (value == (dlep_parser_value *)0x0) {
      return -1;
    }
  }
  iVar1 = netaddr_from_binary_prefix
                    (&key->addr,(session->parser).tlv_ptr + value->index,(ulong)value->length,'\0',
                     0xff);
  return iVar1;
}

Assistant:

int
dlep_reader_mac_tlv(struct oonf_layer2_neigh_key *key, struct dlep_session *session, struct dlep_parser_value *value) {
  const uint8_t *ptr;

  if (!value) {
    value = dlep_session_get_tlv_value(session, DLEP_MAC_ADDRESS_TLV);
    if (!value) {
      return -1;
    }
  }

  ptr = dlep_session_get_tlv_binary(session, value);
  return netaddr_from_binary(&key->addr, ptr, value->length, 0);
}